

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall duckdb_fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  uVar5 = (ulong)(uint)(other->bigits_).super_buffer<unsigned_int>.size_;
  if (uVar5 != 0) {
    puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar3 = (long)(other->exp_ - this->exp_);
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar4 = lVar3 << 0x20;
    uVar6 = 0;
    lVar7 = 0;
    do {
      lVar4 = lVar4 + 0x100000000;
      lVar8 = (ulong)puVar2[lVar3 + uVar6] + (lVar7 - (ulong)puVar1[uVar6]);
      puVar2[lVar3 + uVar6] = (uint)lVar8;
      lVar7 = lVar8 >> 0x3f;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    if (lVar8 < 0) {
      puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar5 = (ulong)*(uint *)((long)puVar1 + (lVar4 >> 0x1e));
      lVar3 = -1;
      do {
        uVar5 = (uVar5 & 0xffffffff) + lVar3;
        lVar3 = (long)uVar5 >> 0x3f;
      } while ((long)uVar5 < 0);
      *(int *)((long)puVar1 + (lVar4 >> 0x1e)) = (int)uVar5;
      remove_leading_zeros(this);
      return;
    }
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

std::size_t size() const FMT_NOEXCEPT { return size_; }